

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_definition.cpp
# Opt level: O3

ParsedExpression * __thiscall duckdb::ColumnDefinition::DefaultValue(ColumnDefinition *this)

{
  TableColumnType TVar1;
  type pPVar2;
  InternalException *this_00;
  string local_40;
  
  TVar1 = this->category;
  if ((TVar1 != GENERATED) &&
     ((this->expression).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0)) {
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(&this->expression);
    return pPVar2;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  if (TVar1 == GENERATED) {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Calling DefaultValue() on a generated column","");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"DefaultValue() called on a column without a default value","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool ColumnDefinition::Generated() const {
	return category == TableColumnType::GENERATED;
}